

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O3

int rd_advance(mpt_rawdata *ptr)

{
  long lVar1;
  _mpt_vptr_rawdata *p_Var2;
  
  p_Var2 = (_mpt_vptr_rawdata *)((long)&(ptr[3]._vptr)->modify + 1);
  if ((long)ptr[4]._vptr <= (long)p_Var2) {
    p_Var2 = (_mpt_vptr_rawdata *)0x0;
  }
  if ((ptr[2]._vptr == (_mpt_vptr_rawdata *)0x0) ||
     ((long)((ulong)(ptr[2]._vptr)->dimension_count >> 4) <= (long)p_Var2)) {
    lVar1 = mpt_array_append(ptr + 2,0x10,0);
    if (lVar1 == 0) {
      return 0;
    }
    ptr[3]._vptr = p_Var2;
  }
  return (int)p_Var2;
}

Assistant:

static int rd_advance(MPT_INTERFACE(rawdata) *ptr)
{
	MPT_STRUCT(RawData) *rd = MPT_baseaddr(RawData, ptr, _rd);
	const MPT_STRUCT(buffer) *buf;
	long act;
	
	/* limit cycle size */
	if ((act = rd->act + 1) >= rd->max) {
		act = 0;
	}
	/* reuse existing cycle */
	if ((buf = rd->st._buf)
	    && act < (long) (buf->_used / sizeof(MPT_STRUCT(rawdata_stage)))) {
		return act;
	}
	/* add cycle placeholder */
	if (!mpt_array_append(&rd->st, sizeof(MPT_STRUCT(rawdata_stage)), 0)) {
		return 0;
	}
	rd->act = act;
	return act;
}